

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceDynamicProfileManager.h
# Opt level: O0

void __thiscall
Js::SourceDynamicProfileManager::SourceDynamicProfileManager
          (SourceDynamicProfileManager *this,Recycler *allocator)

{
  nullptr_t local_40;
  nullptr_t local_38 [3];
  nullptr_t local_20;
  Recycler *local_18;
  Recycler *allocator_local;
  SourceDynamicProfileManager *this_local;
  
  this->recycler = allocator;
  local_18 = allocator;
  allocator_local = (Recycler *)this;
  JsUtil::
  BaseDictionary<unsigned_int,_Js::DynamicProfileInfo_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  ::BaseDictionary(&this->dynamicProfileInfoMapSaving,&Memory::HeapAllocator::Instance,0);
  this->isNonCachableScript = false;
  local_20 = (nullptr_t)0x0;
  Memory::WriteBarrierPtr<Js::SimpleDataCacheWrapper>::WriteBarrierPtr
            (&this->dataCacheWrapper,&local_20);
  local_38[0] = (nullptr_t)0x0;
  Memory::WriteBarrierPtr<BVFixed>::WriteBarrierPtr(&this->startupFunctions,local_38);
  local_40 = (nullptr_t)0x0;
  Memory::WriteBarrierPtr<const_BVFixed>::WriteBarrierPtr(&this->cachedStartupFunctions,&local_40);
  JsUtil::
  BaseDictionary<unsigned_int,_Js::DynamicProfileInfo_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  ::BaseDictionary(&this->dynamicProfileInfoMap,local_18,0);
  return;
}

Assistant:

SourceDynamicProfileManager(Recycler* allocator) : isNonCachableScript(false), cachedStartupFunctions(nullptr), recycler(allocator),
#ifdef DYNAMIC_PROFILE_STORAGE
            dynamicProfileInfoMapSaving(&HeapAllocator::Instance),
#endif
            dynamicProfileInfoMap(allocator), startupFunctions(nullptr), dataCacheWrapper(nullptr) 
        {
        }